

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_root_name_abi_cxx11_(string_view path)

{
  string *in_RDI;
  path local_70;
  path local_48;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&local_20,auto_format);
  std::filesystem::__cxx11::path::root_name();
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_48);
  return in_RDI;
}

Assistant:

std::string fs_root_name(FFS_MAYBE_UNUSED std::string_view path)
{

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).root_name().string();
#elif defined(_WIN32)
  char drive[_MAX_DRIVE];
// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/splitpath-s-wsplitpath-s
  if(_splitpath_s(path.data(), drive, _MAX_DRIVE, nullptr, 0, nullptr, 0, nullptr, 0) == 0)
    return fs_trim(drive);
#endif
  return {};
}